

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O3

stacktrace *
cpptrace::generate_trace(stacktrace *__return_storage_ptr__,size_t skip,size_t max_depth)

{
  pointer psVar1;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *__range2;
  stacktrace_frame *frame;
  pointer psVar2;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> trace;
  vector<unsigned_long,_std::allocator<unsigned_long>_> frames;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  string local_50;
  
  detail::capture_frames(&local_68,skip + 1,max_depth);
  detail::resolve_frames(&local_88,&local_68);
  psVar1 = local_88.
           super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_88.
      super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_88.
      super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    psVar2 = local_88.
             super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      detail::demangle(&local_50,&psVar2->symbol);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&psVar2->symbol,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      psVar2 = psVar2 + 1;
    } while (psVar2 != psVar1);
  }
  (__return_storage_ptr__->frames).
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_88.
       super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->frames).
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_88.
       super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->frames).
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_88.
       super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::~vector
            (&local_88);
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

CPPTRACE_FORCE_NO_INLINE
    stacktrace generate_trace(std::size_t skip, std::size_t max_depth) {
        try {
            std::vector<frame_ptr> frames = detail::capture_frames(skip + 1, max_depth);
            std::vector<stacktrace_frame> trace = detail::resolve_frames(frames);
            for(auto& frame : trace) {
                frame.symbol = detail::demangle(frame.symbol);
            }
            return {std::move(trace)};
        } catch(...) { // NOSONAR
            if(!detail::should_absorb_trace_exceptions()) {
                throw;
            }
            return stacktrace();
        }
    }